

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedRun.cpp
# Opt level: O2

void __thiscall IntersectionHelper::step_single(IntersectionHelper *this)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  uint32_t uVar5;
  uint uVar6;
  uint8_t *puVar7;
  
  iVar1 = this->prev_;
  puVar7 = this->run_it_;
  uVar5 = run_read(puVar7);
  uVar6 = uVar5 + iVar1;
  puVar3 = this->seq_it_;
  uVar2 = *puVar3;
  if (uVar6 < uVar2) {
    this->prev_ = uVar6;
    puVar7 = run_forward(puVar7);
    this->run_it_ = puVar7;
  }
  else {
    if (uVar6 == uVar2) {
      puVar4 = this->seq_out_;
      this->seq_out_ = puVar4 + 1;
      *puVar4 = uVar6;
      this->prev_ = uVar6;
      puVar7 = run_forward(puVar7);
      this->run_it_ = puVar7;
    }
    this->seq_it_ = puVar3 + 1;
  }
  return;
}

Assistant:

void IntersectionHelper::step_single() {
    uint32_t next = prev_ + run_read(run_it_);
    if (next < *seq_it_) {
        prev_ = next;
        run_it_ = run_forward(run_it_);
        return;
    }
    if (*seq_it_ == next) {
        *seq_out_++ = *seq_it_;
        prev_ = next;
        run_it_ = run_forward(run_it_);
    }
    seq_it_++;
}